

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O2

_Bool bin_update_shard_size(uint *bin_shard_sizes,size_t start_size,size_t end_size,size_t nshards)

{
  szind_t sVar1;
  szind_t sVar2;
  uint i;
  size_t size;
  
  if (start_size < 0x3801 && 0xffffffffffffffbf < nshards - 0x41) {
    size = 0x3800;
    if (end_size < 0x3800) {
      size = end_size;
    }
    sVar1 = sz_size2index_compute(start_size);
    sVar2 = sz_size2index_compute(size);
    for (; sVar1 <= sVar2; sVar1 = sVar1 + 1) {
      bin_shard_sizes[sVar1] = (uint)nshards;
    }
  }
  return nshards - 0x41 < 0xffffffffffffffc0;
}

Assistant:

bool
bin_update_shard_size(unsigned bin_shard_sizes[SC_NBINS], size_t start_size,
    size_t end_size, size_t nshards) {
	if (nshards > BIN_SHARDS_MAX || nshards == 0) {
		return true;
	}

	if (start_size > SC_SMALL_MAXCLASS) {
		return false;
	}
	if (end_size > SC_SMALL_MAXCLASS) {
		end_size = SC_SMALL_MAXCLASS;
	}

	/* Compute the index since this may happen before sz init. */
	szind_t ind1 = sz_size2index_compute(start_size);
	szind_t ind2 = sz_size2index_compute(end_size);
	for (unsigned i = ind1; i <= ind2; i++) {
		bin_shard_sizes[i] = (unsigned)nshards;
	}

	return false;
}